

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O1

void __thiscall amrex::AmrMesh::SetBoxArray(AmrMesh *this,int lev,BoxArray *ba_in)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pBVar1;
  bool bVar2;
  long lVar3;
  BoxArray *pBVar4;
  pointer pBVar5;
  byte bVar6;
  
  bVar6 = 0;
  this->num_setba = this->num_setba + 1;
  bVar2 = BoxArray::operator!=
                    ((this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lev,ba_in);
  if (bVar2) {
    pBVar1 = (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4 = ba_in;
    pBVar5 = pBVar1 + lev;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)&pBVar5->m_bat = *(undefined8 *)&pBVar4->m_bat;
      pBVar4 = (BoxArray *)((long)pBVar4 + (ulong)bVar6 * -0x10 + 8);
      pBVar5 = (pointer)((long)pBVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&pBVar1[lev].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
              + 8);
    ((__shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2> *)(this_00 + -1))->_M_ptr =
         (ba_in->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(ba_in->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    this_00[1]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ba_in->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&pBVar1[lev].m_simplified_list.
                       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2> + 8),
               &(ba_in->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  return;
}

Assistant:

void
AmrMesh::SetBoxArray (int lev, const BoxArray& ba_in) noexcept
{
    ++num_setba;
    if (grids[lev] != ba_in) grids[lev] = ba_in;
}